

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderIndexingCase::setupUniforms
          (ShaderIndexingCase *this,int programID,Vec4 *constCoords)

{
  code *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  float *pfVar4;
  TestError *this_00;
  int a;
  float fVar5;
  Vector<float,_4> *local_280;
  Vector<float,_3> *local_258;
  Vector<float,_2> *local_230;
  allocator<char> local_209;
  string local_208;
  Vector<float,_4> local_1e8;
  tcu local_1d8 [8];
  float local_1d0 [2];
  Vector<float,_4> local_1c8;
  tcu local_1b8 [8];
  float local_1b0 [2];
  Vector<float,_4> local_1a8;
  tcu local_198 [8];
  float local_190 [2];
  Vector<float,_4> local_188;
  undefined1 local_178 [8];
  Vec4 arr_3 [4];
  undefined1 local_12c [12];
  float local_120 [2];
  float local_118;
  undefined1 local_114 [12];
  float local_108 [2];
  float local_100;
  undefined1 local_fc [12];
  float local_f0 [2];
  float local_e8;
  undefined1 local_e4 [20];
  Vec3 arr_2 [4];
  undefined1 local_a0 [8];
  float local_98 [2];
  undefined1 local_90 [8];
  float local_88 [2];
  undefined1 local_80 [8];
  float local_78 [2];
  float local_70 [2];
  Vector<float,_2> local_68;
  Vec2 arr_1 [4];
  float arr [4];
  int arrLoc;
  Functions *gl;
  Vec4 *constCoords_local;
  int programID_local;
  ShaderIndexingCase *this_local;
  long lVar3;
  
  iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = (**(code **)(lVar3 + 0xb48))(programID,"u_arr");
  if (iVar2 != -1) {
    if (this->m_varType == TYPE_FLOAT) {
      arr_1[3].m_data[0] = tcu::Vector<float,_4>::x(constCoords);
      fVar5 = tcu::Vector<float,_4>::x(constCoords);
      arr_1[3].m_data[1] = fVar5 * 0.5;
      tcu::Vector<float,_4>::x(constCoords);
      tcu::Vector<float,_4>::x(constCoords);
      (**(code **)(lVar3 + 0x14e8))(iVar2,4,arr_1 + 3);
    }
    else {
      a = (int)constCoords;
      if (this->m_varType == TYPE_FLOAT_VEC2) {
        local_230 = &local_68;
        do {
          tcu::Vector<float,_2>::Vector(local_230);
          local_230 = local_230 + 1;
        } while (local_230 != arr_1 + 3);
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_70,a,0);
        local_68.m_data[0] = local_70[0];
        local_68.m_data[1] = local_70[1];
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_80,a,0);
        tcu::operator*((tcu *)local_78,(Vector<float,_2> *)local_80,0.5);
        arr_1[0].m_data[0] = local_78[0];
        arr_1[0].m_data[1] = local_78[1];
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_90,a,0);
        tcu::operator*((tcu *)local_88,(Vector<float,_2> *)local_90,0.25);
        arr_1[1].m_data[0] = local_88[0];
        arr_1[1].m_data[1] = local_88[1];
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_a0,a,0);
        tcu::operator*((tcu *)local_98,(Vector<float,_2> *)local_a0,0.125);
        arr_1[2].m_data[0] = local_98[0];
        arr_1[2].m_data[1] = local_98[1];
        pcVar1 = *(code **)(lVar3 + 0x1528);
        pfVar4 = tcu::Vector<float,_2>::getPtr(&local_68);
        (*pcVar1)(iVar2,4,pfVar4);
      }
      else if (this->m_varType == TYPE_FLOAT_VEC3) {
        local_258 = (Vector<float,_3> *)(local_e4 + 0xc);
        do {
          tcu::Vector<float,_3>::Vector(local_258);
          local_258 = local_258 + 1;
        } while (local_258 != (Vector<float,_3> *)(arr_2[3].m_data + 1));
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_e4,a,0,1);
        local_e4._12_8_ = local_e4._0_8_;
        arr_2[0].m_data[0] = (float)local_e4._8_4_;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_fc,a,0,1);
        tcu::operator*((tcu *)local_f0,(Vector<float,_3> *)local_fc,0.5);
        arr_2[0].m_data[1] = local_f0[0];
        arr_2[0].m_data[2] = local_f0[1];
        arr_2[1].m_data[0] = local_e8;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_114,a,0,1);
        tcu::operator*((tcu *)local_108,(Vector<float,_3> *)local_114,0.25);
        arr_2[1].m_data[1] = local_108[0];
        arr_2[1].m_data[2] = local_108[1];
        arr_2[2].m_data[0] = local_100;
        tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_12c,a,0,1);
        tcu::operator*((tcu *)local_120,(Vector<float,_3> *)local_12c,0.125);
        arr_2[2].m_data[1] = local_120[0];
        arr_2[2].m_data[2] = local_120[1];
        arr_2[3].m_data[0] = local_118;
        pcVar1 = *(code **)(lVar3 + 0x1568);
        pfVar4 = tcu::Vector<float,_3>::getPtr((Vector<float,_3> *)(local_e4 + 0xc));
        (*pcVar1)(iVar2,4,pfVar4);
      }
      else {
        if (this->m_varType != TYPE_FLOAT_VEC4) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,
                     "u_arr should not have location assigned in this test case",&local_209);
          tcu::TestError::TestError(this_00,&local_208);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_280 = (Vector<float,_4> *)local_178;
        do {
          tcu::Vector<float,_4>::Vector(local_280);
          local_280 = local_280 + 1;
        } while (local_280 != (Vector<float,_4> *)(arr_3[3].m_data + 2));
        tcu::Vector<float,_4>::swizzle(&local_188,a,0,1,2);
        local_178._0_4_ = local_188.m_data[0];
        local_178._4_4_ = local_188.m_data[1];
        arr_3[0].m_data[0] = local_188.m_data[2];
        arr_3[0].m_data[1] = local_188.m_data[3];
        tcu::Vector<float,_4>::swizzle(&local_1a8,a,0,1,2);
        tcu::operator*(local_198,&local_1a8,0.5);
        arr_3[0].m_data._8_8_ = local_198;
        arr_3[1].m_data[0] = local_190[0];
        arr_3[1].m_data[1] = local_190[1];
        tcu::Vector<float,_4>::swizzle(&local_1c8,a,0,1,2);
        tcu::operator*(local_1b8,&local_1c8,0.25);
        arr_3[1].m_data._8_8_ = local_1b8;
        arr_3[2].m_data[0] = local_1b0[0];
        arr_3[2].m_data[1] = local_1b0[1];
        tcu::Vector<float,_4>::swizzle(&local_1e8,a,0,1,2);
        tcu::operator*(local_1d8,&local_1e8,0.125);
        arr_3[2].m_data._8_8_ = local_1d8;
        arr_3[3].m_data[0] = local_1d0[0];
        arr_3[3].m_data[1] = local_1d0[1];
        pcVar1 = *(code **)(lVar3 + 0x15a8);
        pfVar4 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_178);
        (*pcVar1)(iVar2,4,pfVar4);
      }
    }
  }
  return;
}

Assistant:

void ShaderIndexingCase::setupUniforms (int programID, const Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	int arrLoc = gl.getUniformLocation(programID, "u_arr");
	if (arrLoc != -1)
	{
		//int scalarSize = getDataTypeScalarSize(m_varType);
		if (m_varType == TYPE_FLOAT)
		{
			float arr[4];
			arr[0] = constCoords.x();
			arr[1] = constCoords.x() * 0.5f;
			arr[2] = constCoords.x() * 0.25f;
			arr[3] = constCoords.x() * 0.125f;
			gl.uniform1fv(arrLoc, 4, &arr[0]);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			Vec2 arr[4];
			arr[0] = constCoords.swizzle(0,1);
			arr[1] = constCoords.swizzle(0,1) * 0.5f;
			arr[2] = constCoords.swizzle(0,1) * 0.25f;
			arr[3] = constCoords.swizzle(0,1) * 0.125f;
			gl.uniform2fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			Vec3 arr[4];
			arr[0] = constCoords.swizzle(0,1,2);
			arr[1] = constCoords.swizzle(0,1,2) * 0.5f;
			arr[2] = constCoords.swizzle(0,1,2) * 0.25f;
			arr[3] = constCoords.swizzle(0,1,2) * 0.125f;
			gl.uniform3fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			Vec4 arr[4];
			arr[0] = constCoords.swizzle(0,1,2,3);
			arr[1] = constCoords.swizzle(0,1,2,3) * 0.5f;
			arr[2] = constCoords.swizzle(0,1,2,3) * 0.25f;
			arr[3] = constCoords.swizzle(0,1,2,3) * 0.125f;
			gl.uniform4fv(arrLoc, 4, arr[0].getPtr());
		}
		else
			throw tcu::TestError("u_arr should not have location assigned in this test case");
	}
}